

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  anon_class_16_2_7fa2747b_for__M_pred __pred;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __last;
  bool bVar1;
  int32_t iVar2;
  iterator iVar3;
  iterator iVar4;
  reference pvVar5;
  pointer peVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  int32_t h;
  iterator it;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  const_iterator in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  in_stack_ffffffffffffff78;
  
  iVar3 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin
                    (in_stack_ffffffffffffff38);
  iVar4 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end
                    (in_stack_ffffffffffffff38);
  std::
  sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,fasttext::Dictionary::threshold(long,long)::__0>
            (iVar3._M_current,iVar4._M_current);
  __last_00._M_current = in_RDI._M_current + 10;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin(in_stack_ffffffffffffff38);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffff38);
  __last._M_current._4_4_ = in_stack_ffffffffffffff74;
  __last._M_current._0_4_ = in_stack_ffffffffffffff70;
  __pred.tl = (int64_t *)in_stack_ffffffffffffff68._M_current;
  __pred.t = (int64_t *)in_stack_ffffffffffffff60._M_current;
  std::
  remove_if<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,fasttext::Dictionary::threshold(long,long)::__1>
            (in_stack_ffffffffffffff78,__last,__pred);
  __gnu_cxx::
  __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
  ::__normal_iterator<fasttext::entry*>
            ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)in_stack_ffffffffffffff38);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
  ::__normal_iterator<fasttext::entry*>
            ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)in_stack_ffffffffffffff38);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_stack_ffffffffffffff68
             ,in_stack_ffffffffffffff60);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::shrink_to_fit
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x15f8cc);
  in_RDI._M_current[0x16] = 0;
  in_RDI._M_current[0x17] = 0;
  in_RDI._M_current[0x18] = 0;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_RDI,__last_00,(int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin(in_stack_ffffffffffffff38);
  while( true ) {
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffff38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator->((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)&stack0xffffffffffffff68);
    iVar2 = find((Dictionary *)in_RDI._M_current,(string *)__last_00._M_current);
    in_stack_ffffffffffffff44 = ((Dictionary *)in_RDI._M_current)->size_;
    ((Dictionary *)in_RDI._M_current)->size_ = in_stack_ffffffffffffff44 + 1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&((Dictionary *)in_RDI._M_current)->word2int_,(long)iVar2);
    *pvVar5 = in_stack_ffffffffffffff44;
    peVar6 = __gnu_cxx::
             __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator->((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                           *)&stack0xffffffffffffff68);
    if (peVar6->type == word) {
      ((Dictionary *)in_RDI._M_current)->nwords_ = ((Dictionary *)in_RDI._M_current)->nwords_ + 1;
    }
    peVar6 = __gnu_cxx::
             __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator->((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                           *)&stack0xffffffffffffff68);
    if (peVar6->type == label) {
      ((Dictionary *)in_RDI._M_current)->nlabels_ = ((Dictionary *)in_RDI._M_current)->nlabels_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator++((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)&stack0xffffffffffffff68);
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}